

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

void __thiscall Func::RemoveDeadYieldOffsetResumeLabel(Func *this,LabelInstr *label)

{
  code *pcVar1;
  anon_class_16_2_767aac4c map;
  bool bVar2;
  undefined4 *puVar3;
  Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> local_48;
  uint32 *local_30;
  LabelInstr **local_28;
  undefined1 local_1d;
  uint32 local_1c;
  bool found;
  LabelInstr *pLStack_18;
  uint32 offset;
  LabelInstr *label_local;
  Func *this_local;
  
  local_30 = &local_1c;
  local_28 = &stack0xffffffffffffffe8;
  map.label = local_28;
  map.offset = local_30;
  pLStack_18 = label;
  label_local = (LabelInstr *)this;
  local_1d = JsUtil::
             List<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
             ::
             MapUntil<Func::RemoveDeadYieldOffsetResumeLabel(IR::LabelInstr*)::_lambda(int,JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>&)_1_>
                       ((List<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                         *)this->m_yieldOffsetResumeLabelList,map);
  if (!(bool)local_1d) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x3b5,"(found)","found");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Pair
            (&local_48,&local_1c,&stack0xffffffffffffffe8);
  RemoveYieldOffsetResumeLabel(this,&local_48);
  AddYieldOffsetResumeLabel(this,local_1c,(LabelInstr *)0x0);
  return;
}

Assistant:

void RemoveDeadYieldOffsetResumeLabel(IR::LabelInstr* label)
    {
        uint32 offset;
        bool found = m_yieldOffsetResumeLabelList->MapUntil([&offset, &label](int i, YieldOffsetResumeLabel& yorl)
        {
            if (yorl.Second() == label)
            {
                offset = yorl.First();
                return true;
            }
            return false;
        });
        Assert(found);
        RemoveYieldOffsetResumeLabel(YieldOffsetResumeLabel(offset, label));
        AddYieldOffsetResumeLabel(offset, nullptr);
    }